

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBuffer.cpp
# Opt level: O2

void __thiscall yb::LineBuffer::move(LineBuffer *this,int n)

{
  char *pcVar1;
  pointer pcVar2;
  
  pcVar1 = (this->position_)._M_current;
  if ((n < 0) &&
     (pcVar2 = (this->buffer_)._M_dataplus._M_p, (long)pcVar1 - (long)pcVar2 < (long)(ulong)(uint)-n
     )) {
    (this->position_)._M_current = pcVar2;
  }
  else {
    (this->position_)._M_current = pcVar1 + n;
  }
  return;
}

Assistant:

void LineBuffer::move(int n) {
    auto begin = std::begin(buffer_);
    if (n < 0 && std::distance(begin, position_) < -n) {
        position_ = begin;
    }
    else {
        position_ += n;
    }
}